

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PendingListAppend
              (PendingList **pp,sqlite3_int64 iDocid,sqlite3_int64 iCol,sqlite3_int64 iPos,int *pRc)

{
  PendingList *pPVar1;
  int iVar2;
  sqlite3_int64 i;
  long in_FS_OFFSET;
  PendingList *p;
  PendingList *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = *pp;
  i = iDocid;
  if (local_40 == (PendingList *)0x0) {
LAB_001cddcd:
    iVar2 = fts3PendingListAppendVarint(&local_40,i);
    if (iVar2 != 0) goto LAB_001cde43;
    local_40->iLastCol = -1;
    local_40->iLastPos = 0;
    local_40->iLastDocid = iDocid;
  }
  else {
    i = iDocid - local_40->iLastDocid;
    if (i != 0) {
      local_40->nData = local_40->nData + 1;
      goto LAB_001cddcd;
    }
  }
  if (iCol < 1) {
    if (-1 < iCol) goto LAB_001cde1d;
  }
  else {
    if (local_40->iLastCol != iCol) {
      iVar2 = fts3PendingListAppendVarint(&local_40,1);
      if ((iVar2 != 0) || (iVar2 = fts3PendingListAppendVarint(&local_40,iCol), iVar2 != 0))
      goto LAB_001cde43;
      local_40->iLastCol = iCol;
      local_40->iLastPos = 0;
    }
LAB_001cde1d:
    iVar2 = fts3PendingListAppendVarint(&local_40,(iPos - local_40->iLastPos) + 2);
    if (iVar2 != 0) goto LAB_001cde43;
    local_40->iLastPos = iPos;
  }
  iVar2 = 0;
LAB_001cde43:
  *pRc = iVar2;
  pPVar1 = *pp;
  if (local_40 != pPVar1) {
    *pp = local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (uint)(local_40 != pPVar1);
}

Assistant:

static int fts3PendingListAppend(
  PendingList **pp,               /* IN/OUT: PendingList structure */
  sqlite3_int64 iDocid,           /* Docid for entry to add */
  sqlite3_int64 iCol,             /* Column for entry to add */
  sqlite3_int64 iPos,             /* Position of term for entry to add */
  int *pRc                        /* OUT: Return code */
){
  PendingList *p = *pp;
  int rc = SQLITE_OK;

  assert( !p || p->iLastDocid<=iDocid );

  if( !p || p->iLastDocid!=iDocid ){
    u64 iDelta = (u64)iDocid - (u64)(p ? p->iLastDocid : 0);
    if( p ){
      assert( p->nData<p->nSpace );
      assert( p->aData[p->nData]==0 );
      p->nData++;
    }
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iDelta)) ){
      goto pendinglistappend_out;
    }
    p->iLastCol = -1;
    p->iLastPos = 0;
    p->iLastDocid = iDocid;
  }
  if( iCol>0 && p->iLastCol!=iCol ){
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, 1))
     || SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iCol))
    ){
      goto pendinglistappend_out;
    }
    p->iLastCol = iCol;
    p->iLastPos = 0;
  }
  if( iCol>=0 ){
    assert( iPos>p->iLastPos || (iPos==0 && p->iLastPos==0) );
    rc = fts3PendingListAppendVarint(&p, 2+iPos-p->iLastPos);
    if( rc==SQLITE_OK ){
      p->iLastPos = iPos;
    }
  }

 pendinglistappend_out:
  *pRc = rc;
  if( p!=*pp ){
    *pp = p;
    return 1;
  }
  return 0;
}